

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

byte * __thiscall
Js::InterpreterStackFrame::OP_ProfiledLoopEnd<(Js::LayoutSize)2,false>
          (InterpreterStackFrame *this,byte *ip)

{
  uint uVar1;
  long lVar2;
  BVIndex i;
  bool bVar3;
  OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *pOVar4;
  FunctionBody *this_00;
  DynamicProfileInfo *pDVar5;
  byte *local_30;
  byte *ip_local;
  
  local_30 = ip;
  pOVar4 = ByteCodeReader::
           GetLayout<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
                     ((ByteCodeReader *)this,&local_30);
  if (((byte)this[0xd6] & 0x10) != 0) {
    uVar1 = pOVar4->C1;
    CheckIfLoopIsHot(this,*(uint *)(this + 0xd0));
    this_00 = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(this + 0x80));
    if ((this_00->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
      pDVar5 = FunctionBody::GetAnyDynamicProfileInfo(this_00);
      i = uVar1 * 2;
      BVFixed::Set((pDVar5->loopFlags).ptr,i);
      if ((DAT_015bbde0 <= *(uint *)(this + 0xd0)) ||
         ((*(uint *)(this + 0xd0) == 0 &&
          (bVar3 = FunctionBody::DoJITLoopBody(*(FunctionBody **)(this + 0x88)), !bVar3)))) {
        pDVar5 = FunctionBody::GetAnyDynamicProfileInfo(this_00);
        BVFixed::Set((pDVar5->loopFlags).ptr,i | 1);
      }
    }
    *(undefined4 *)(this + 0xd0) = 0;
    lVar2 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
    *(byte *)(lVar2 + 0x1570) =
         *(byte *)(lVar2 + 0x1570) | *(byte *)(*(long *)(this + 0xc0) + (ulong)uVar1);
    if (*(char *)(lVar2 + 0x1658) != '\0') {
      *(char *)(lVar2 + 0x1658) = *(char *)(lVar2 + 0x1658) + -1;
    }
    return local_30;
  }
  return local_30;
}

Assistant:

const byte * InterpreterStackFrame::OP_ProfiledLoopEnd(const byte * ip)
    {
        uint32 loopNumber = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
        if (!profiled && !isAutoProfiling)
        {
            return ip;
        }

        this->CheckIfLoopIsHot(this->currentLoopCounter);
        Js::FunctionBody *fn = this->function->GetFunctionBody();
        if (fn->HasDynamicProfileInfo())
        {
            fn->GetAnyDynamicProfileInfo()->SetLoopInterpreted(loopNumber);
            // If the counter is 0, there is a high chance that some config disabled tracking that information. (ie: -off:jitloopbody)
            // Assume it is valid for memop in this case.
            if (this->currentLoopCounter >= (uint)CONFIG_FLAG(MinMemOpCount) ||
                (this->currentLoopCounter == 0 && !this->m_functionBody->DoJITLoopBody())
                )
            {
                // This flag becomes relevant only if the loop has been interpreted
                fn->GetAnyDynamicProfileInfo()->SetMemOpMinReached(loopNumber);
            }
        }

        this->currentLoopCounter = 0;

        if (profiled)
        {
            Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));
            OP_RecordImplicitCall(loopNumber);

            if (switchProfileModeOnLoopEndNumber == loopNumber)
            {
                // Stop profiling since the jitted loop body would be exiting the loop
                Assert(!switchProfileMode);
                switchProfileMode = true;
                switchProfileModeOnLoopEndNumber = 0u - 1;
            }
        }

        // Restore the implicit call flags state and add with flags in the loop as well
        ThreadContext *const threadContext = GetScriptContext()->GetThreadContext();
        threadContext->AddImplicitCallFlags(this->savedLoopImplicitCallFlags[loopNumber]);

        threadContext->DecrementLoopDepth();
        return ip;
    }